

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

bool asl::Directory::create(String *name)

{
  bool bVar1;
  bool bVar2;
  undefined8 __src;
  undefined8 __dest;
  String parent;
  Path path;
  Directory local_80;
  String local_60;
  Path local_48;
  String local_30;
  
  if (name->_len < 1) {
    bVar2 = false;
  }
  else {
    bVar1 = createOne(name);
    bVar2 = true;
    if (!bVar1) {
      Path::Path((Path *)&local_80,name);
      Path::absolute(&local_48,(Path *)&local_80);
      if (local_80._path._size != 0) {
        free(local_80._path.field_2._str);
      }
      Path::directory((Path *)&local_80,&local_48);
      String::alloc(&local_60,local_80._path._len);
      local_60._len = local_80._path._len;
      __dest = local_60.field_2._str;
      if (local_60._size == 0) {
        __dest = &local_60.field_2;
      }
      __src = local_80._path.field_2._str;
      if (local_80._path._size == 0) {
        __src = &local_80._path.field_2;
      }
      memcpy((void *)__dest,(void *)__src,(long)local_80._path._len + 1);
      if (local_80._path._size != 0) {
        free(local_80._path.field_2._str);
      }
      Directory(&local_80,&local_60);
      directory(&local_30,&local_80);
      if (local_30._size != 0) {
        free(local_30.field_2._str);
      }
      Array<asl::File>::~Array(&local_80._files);
      if (local_80._path._size != 0) {
        free(local_80._path.field_2._str);
      }
      if ((0 < local_30._len) && (0 < local_60._len)) {
        Directory(&local_80,&local_60);
        bVar2 = exists(&local_80);
        Array<asl::File>::~Array(&local_80._files);
        if (local_80._path._size != 0) {
          free(local_80._path.field_2._str);
        }
        if (!bVar2) {
          create(&local_60);
        }
      }
      bVar2 = createOne(name);
      if (local_60._size != 0) {
        free(local_60.field_2._str);
      }
      if (local_48._path._size != 0) {
        free(local_48._path.field_2._str);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Directory::move(const String& from, const String& to)
{
	String dst = to;
	File tofile(to);
	if(tofile.isDirectory())
		dst = to + '/' + File(from).name();

	if(rename(from, dst) == 0)
		return true;
	if(errno == EXDEV) // different file systems: copy and del
	{
		copy(from, dst);
		remove(from);
	}
	return false;
}